

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferInputSource.cc
# Opt level: O0

void __thiscall BufferInputSource::seek(BufferInputSource *this,qpdf_offset_t offset,int whence)

{
  logic_error *this_00;
  runtime_error *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  int local_1c;
  qpdf_offset_t qStack_18;
  int whence_local;
  qpdf_offset_t offset_local;
  BufferInputSource *this_local;
  
  local_1c = whence;
  qStack_18 = offset;
  offset_local = (qpdf_offset_t)this;
  if (whence == 0) {
    this->cur_offset = offset;
  }
  else if (whence == 1) {
    QIntC::range_check<long_long>(&this->cur_offset,&stack0xffffffffffffffe8);
    this->cur_offset = qStack_18 + this->cur_offset;
  }
  else {
    if (whence != 2) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error
                (this_00,"INTERNAL ERROR: invalid argument to BufferInputSource::seek");
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    QIntC::range_check<long_long>(&this->max_offset,&stack0xffffffffffffffe8);
    this->cur_offset = this->max_offset + qStack_18;
  }
  if (this->cur_offset < 0) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_50,&this->description,": seek before beginning of buffer");
    std::runtime_error::runtime_error(this_01,(string *)&local_50);
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void
BufferInputSource::seek(qpdf_offset_t offset, int whence)
{
    switch (whence) {
    case SEEK_SET:
        this->cur_offset = offset;
        break;

    case SEEK_END:
        QIntC::range_check(this->max_offset, offset);
        this->cur_offset = this->max_offset + offset;
        break;

    case SEEK_CUR:
        QIntC::range_check(this->cur_offset, offset);
        this->cur_offset += offset;
        break;

    default:
        throw std::logic_error("INTERNAL ERROR: invalid argument to BufferInputSource::seek");
        break;
    }

    if (this->cur_offset < 0) {
        throw std::runtime_error(this->description + ": seek before beginning of buffer");
    }
}